

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

void __thiscall Oric::VideoOutput::run_for(VideoOutput *this,Cycles cycles)

{
  uint8_t **ppuVar1;
  byte bVar2;
  InputDataType IVar3;
  uint32_t uVar4;
  ScanTarget *pSVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  byte bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  byte bVar18;
  uint uVar19;
  bool bVar21;
  uint8_t colours [2];
  uint32_t colours_1 [2];
  byte local_4a [2];
  uint32_t local_48 [2];
  CRT *local_40;
  int local_34;
  ulong uVar20;
  
  if ((int)cycles.super_WrappedInt<Cycles>.length_ != 0) {
    local_40 = &this->crt_;
    ppuVar1 = &this->rgb_pixel_target_;
    uVar12 = this->counter_;
    do {
      iVar13 = SUB84(cycles.super_WrappedInt<Cycles>.length_,0);
      iVar9 = iVar13;
      if ((int)uVar12 < this->v_sync_start_position_) {
LAB_00380e1d:
        uVar19 = uVar12 & 0x3f;
        uVar20 = (ulong)uVar19;
        if (uVar19 < 0x28 && (int)uVar12 < 0x3800) {
          if (uVar19 == 0) {
            this->ink_ = '\a';
            this->paper_ = '\0';
            this->blink_text_ = false;
            this->use_alternative_character_set_ = false;
            this->use_double_height_characters_ = false;
            iVar9 = 0xb400;
            if (this->is_graphics_mode_ != false) {
              iVar9 = 0x9800;
            }
            this->character_set_base_address_ = iVar9;
            IVar3 = this->data_type_;
            pSVar5 = (this->crt_).scan_target_;
            iVar9 = (*pSVar5->_vptr_ScanTarget[5])(pSVar5,0xf0,1);
            (this->crt_).allocated_data_length_ = -(ulong)(CONCAT44(extraout_var,iVar9) == 0) | 0xf0
            ;
            *(long *)((long)(&this->frequency_mismatch_warner_ + 1) +
                     (ulong)(IVar3 != Red1Green1Blue1) * 8 + 0x18) = CONCAT44(extraout_var,iVar9);
            uVar12 = this->counter_;
            uVar10 = this->frame_counter_;
            if (uVar12 == 0) {
              uVar10 = uVar10 + 1;
              this->frame_counter_ = uVar10;
              bVar21 = this->next_frame_is_sixty_hertz_ != false;
              iVar9 = 0x4000;
              if (bVar21) {
                iVar9 = 0x3a80;
              }
              this->v_sync_start_position_ = iVar9;
              iVar9 = 0x40c0;
              if (bVar21) {
                iVar9 = 0x3b80;
              }
              this->v_sync_end_position_ = iVar9;
              iVar9 = 0x4e00;
              if (bVar21) {
                iVar9 = 0x4180;
              }
              this->counter_period_ = iVar9;
              uVar12 = 0;
            }
          }
          else {
            uVar10 = this->frame_counter_;
          }
          iVar15 = 0x28 - uVar19;
          if (iVar13 < (int)(0x28 - uVar19)) {
            iVar15 = iVar13;
          }
          bVar8 = ((uVar10 >> 5 & 1) != 0) - 1;
          if (this->blink_text_ == false) {
            bVar8 = 0xff;
          }
          iVar9 = 0;
          if (iVar15 != 0) {
            local_34 = iVar15;
            lVar16 = (long)(int)-uVar19 + 0x28;
            if ((long)iVar13 <= (long)(int)-uVar19 + 0x28) {
              lVar16 = (long)iVar13;
            }
            lVar17 = 0;
            do {
              puVar6 = this->ram_;
              if ((this->counter_ < 0x3200 & this->is_graphics_mode_) == 1) {
                bVar18 = puVar6[lVar17 + (long)(((int)uVar12 >> 6) * 0x28) + uVar20 + 0xa000];
                bVar2 = bVar18;
              }
              else {
                bVar2 = puVar6[lVar17 + (long)(((int)uVar12 >> 9) * 0x28) + uVar20 + 48000];
                bVar18 = puVar6[(int)((bVar2 & 0x7f) * 8 + this->character_set_base_address_ +
                                     ((uint)this->counter_ >>
                                      (this->use_double_height_characters_ & 0x1fU | 6) & 7))];
              }
              bVar11 = (char)bVar2 >> 7 & 7;
              if ((bVar2 & 0x60) == 0) {
                switch(bVar2 & 0x1f) {
                case 0:
                  this->ink_ = '\0';
                  break;
                case 1:
                  this->ink_ = '\x04';
                  break;
                case 2:
                  this->ink_ = '\x02';
                  break;
                case 3:
                  this->ink_ = '\x06';
                  break;
                case 4:
                  this->ink_ = '\x01';
                  break;
                case 5:
                  this->ink_ = '\x05';
                  break;
                case 6:
                  this->ink_ = '\x03';
                  break;
                case 7:
                  this->ink_ = '\a';
                  break;
                default:
                  this->use_alternative_character_set_ = (bool)(bVar2 & 1);
                  this->use_double_height_characters_ = (bool)(bVar2 >> 1 & 1);
                  this->blink_text_ = (bool)(bVar2 >> 2 & 1);
                  iVar15 = (bVar2 & 1) * 0x400;
                  iVar9 = iVar15 + 0xb400;
                  if (this->is_graphics_mode_ != false) {
                    iVar9 = iVar15 + 0x9800;
                  }
                  this->character_set_base_address_ = iVar9;
                  break;
                case 0x10:
                  this->paper_ = '\0';
                  break;
                case 0x11:
                  this->paper_ = '\x04';
                  break;
                case 0x12:
                  this->paper_ = '\x02';
                  break;
                case 0x13:
                  this->paper_ = '\x06';
                  break;
                case 0x14:
                  this->paper_ = '\x01';
                  break;
                case 0x15:
                  this->paper_ = '\x05';
                  break;
                case 0x16:
                  this->paper_ = '\x03';
                  break;
                case 0x17:
                  this->paper_ = '\a';
                  break;
                case 0x18:
                case 0x19:
                case 0x1a:
                case 0x1b:
                case 0x1c:
                case 0x1d:
                case 0x1e:
                case 0x1f:
                  this->is_graphics_mode_ = (bool)(bVar2 >> 2 & 1);
                  this->next_frame_is_sixty_hertz_ = (bVar2 & 2) == 0;
                }
                if ((this->data_type_ == Red1Green1Blue1) && (*ppuVar1 != (uint8_t *)0x0)) {
                  bVar11 = bVar11 ^ this->paper_;
                  (*ppuVar1)[5] = bVar11;
                  this->rgb_pixel_target_[4] = bVar11;
                  this->rgb_pixel_target_[3] = bVar11;
                  this->rgb_pixel_target_[2] = bVar11;
                  this->rgb_pixel_target_[1] = bVar11;
                  *this->rgb_pixel_target_ = bVar11;
                }
                else {
                  puVar7 = this->composite_pixel_target_;
                  if (puVar7 != (uint32_t *)0x0) {
                    uVar4 = this->colour_forms_[bVar11 ^ this->paper_];
                    puVar7[5] = uVar4;
                    puVar7[4] = uVar4;
                    *puVar7 = uVar4;
                    puVar7[1] = uVar4;
                    puVar7[2] = uVar4;
                    puVar7[3] = uVar4;
                  }
                }
              }
              else {
                bVar18 = bVar18 & bVar8;
                if ((this->data_type_ == Red1Green1Blue1) && (*ppuVar1 != (byte *)0x0)) {
                  local_4a[0] = this->paper_ ^ bVar11;
                  local_4a[1] = bVar11 ^ this->ink_;
                  **ppuVar1 = local_4a[(bVar18 >> 5 & 1) != 0];
                  this->rgb_pixel_target_[1] = local_4a[(bVar18 >> 4 & 1) != 0];
                  this->rgb_pixel_target_[2] = local_4a[(bVar18 >> 3 & 1) != 0];
                  this->rgb_pixel_target_[3] = local_4a[(bVar18 >> 2 & 1) != 0];
                  this->rgb_pixel_target_[4] = local_4a[(bVar18 >> 1 & 1) != 0];
                  this->rgb_pixel_target_[5] = local_4a[bVar18 & 1];
                }
                else {
                  puVar7 = this->composite_pixel_target_;
                  if (puVar7 != (uint32_t *)0x0) {
                    local_48[0] = this->colour_forms_[this->paper_ ^ bVar11];
                    local_48[1] = this->colour_forms_[bVar11 ^ this->ink_];
                    *puVar7 = *(uint32_t *)((long)local_48 + (ulong)(bVar18 >> 3 & 4));
                    puVar7[1] = *(uint32_t *)((long)local_48 + (ulong)(bVar18 >> 2 & 4));
                    uVar19 = (uint)bVar18;
                    puVar7[2] = *(uint32_t *)((long)local_48 + (ulong)(bVar18 >> 1 & 4));
                    puVar7[3] = *(uint32_t *)((long)local_48 + (ulong)(uVar19 & 4));
                    puVar7[4] = *(uint32_t *)((long)local_48 + (ulong)(uVar19 & 2) * 2);
                    puVar7[5] = local_48[uVar19 & 1];
                  }
                }
              }
              if (*ppuVar1 != (uint8_t *)0x0) {
                *ppuVar1 = *ppuVar1 + 6;
              }
              if (this->composite_pixel_target_ != (uint32_t *)0x0) {
                this->composite_pixel_target_ = this->composite_pixel_target_ + 6;
              }
              lVar17 = lVar17 + 1;
            } while ((int)lVar16 != (int)lVar17);
            iVar9 = local_34;
            if (0x28 - uVar20 == lVar17) {
              Outputs::CRT::CRT::output_data(local_40,0xf0,0xf0);
              this->rgb_pixel_target_ = (uint8_t *)0x0;
              this->composite_pixel_target_ = (uint32_t *)0x0;
              iVar9 = local_34;
            }
          }
        }
        else if (uVar19 < 0x30) {
          iVar15 = 0x30 - uVar19;
          if (iVar15 <= iVar13) {
            iVar9 = 0x120;
            if ((int)uVar12 < 0x3800) {
              iVar9 = 0x30;
            }
LAB_00380e79:
            Outputs::CRT::CRT::output_blank(local_40,iVar9);
            iVar9 = iVar15;
          }
        }
        else if (uVar19 < 0x36) {
          iVar14 = 0x36 - uVar19;
          if (iVar14 <= iVar13) {
            iVar9 = 0x24;
            goto LAB_00380ea6;
          }
        }
        else if (uVar19 < 0x38) {
          if ((int)(0x38 - uVar19) <= iVar13) {
            Outputs::CRT::CRT::output_default_colour_burst(local_40,0xc,')');
            iVar9 = 0x38 - uVar19;
          }
        }
        else {
          iVar15 = 0x40 - uVar19;
          if (iVar15 <= iVar13) {
            iVar9 = 0x30;
            goto LAB_00380e79;
          }
        }
      }
      else {
        iVar15 = this->v_sync_end_position_;
        iVar14 = iVar15 - uVar12;
        if (iVar14 == 0 || iVar15 < (int)uVar12) goto LAB_00380e1d;
        if (iVar14 <= iVar13) {
          iVar9 = (iVar15 - this->v_sync_start_position_) * 6;
LAB_00380ea6:
          Outputs::CRT::CRT::output_sync(local_40,iVar9);
          iVar9 = iVar14;
        }
      }
      uVar12 = (this->counter_ + iVar9) % this->counter_period_;
      this->counter_ = uVar12;
      cycles.super_WrappedInt<Cycles>.length_ = (WrappedInt<Cycles>)(ulong)(uint)(iVar13 - iVar9);
    } while (iVar13 - iVar9 != 0);
  }
  return;
}

Assistant:

void VideoOutput::run_for(const Cycles cycles) {
	// Horizontal: 0-39: pixels; otherwise blank; 48-53 sync, 54-56 colour burst.
	// Vertical: 0-223: pixels; otherwise blank; 256-259 (50Hz) or 234-238 (60Hz) sync.

#define clamp(action)	\
	if(cycles_run_for <= number_of_cycles) { action; } else cycles_run_for = number_of_cycles;

	int number_of_cycles = int(cycles.as_integral());
	while(number_of_cycles) {
		int h_counter = counter_ & 63;
		int cycles_run_for = 0;

		if(counter_ >= v_sync_start_position_ && counter_ < v_sync_end_position_) {
			// this is a sync line
			cycles_run_for = v_sync_end_position_ - counter_;
			clamp(crt_.output_sync((v_sync_end_position_ - v_sync_start_position_) * 6));
		} else if(counter_ < 224*64 && h_counter < 40) {
			// this is a pixel line
			if(!h_counter) {
				ink_ = 0x7;
				paper_ = 0x0;
				use_alternative_character_set_ = use_double_height_characters_ = blink_text_ = false;
				set_character_set_base_address();

				if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1) {
					rgb_pixel_target_ = reinterpret_cast<uint8_t *>(crt_.begin_data(240));
				} else {
					composite_pixel_target_ = reinterpret_cast<uint32_t *>(crt_.begin_data(240));
				}

				if(!counter_) {
					frame_counter_++;

					v_sync_start_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncStartPosition : PAL50VSyncStartPosition;
					v_sync_end_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncEndPosition : PAL50VSyncEndPosition;
					counter_period_ = next_frame_is_sixty_hertz_ ? PAL60Period : PAL50Period;
				}
			}

			cycles_run_for = std::min(40 - h_counter, number_of_cycles);
			int columns = cycles_run_for;
			int pixel_base_address = 0xa000 + (counter_ >> 6) * 40;
			int character_base_address = 0xbb80 + (counter_ >> 9) * 40;
			const uint8_t blink_mask = (blink_text_ && (frame_counter_&32)) ? 0x00 : 0xff;

			while(columns--) {
				uint8_t pixels, control_byte;

				if(is_graphics_mode_ && counter_ < 200*64) {
					control_byte = pixels = ram_[pixel_base_address + h_counter];
				} else {
					int address = character_base_address + h_counter;
					control_byte = ram_[address];
					const int line = use_double_height_characters_ ? ((counter_ >> 7) & 7) : ((counter_ >> 6) & 7);
					pixels = ram_[character_set_base_address_ + (control_byte&127) * 8 + line];
				}

				const uint8_t inverse_mask = (control_byte & 0x80) ? 0x7 : 0x0;
				pixels &= blink_mask;

				if(control_byte & 0x60) {
					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						const uint8_t colours[2] = {
							uint8_t(paper_ ^ inverse_mask),
							uint8_t(ink_ ^ inverse_mask)
						};
						rgb_pixel_target_[0] = colours[(pixels >> 5)&1];
						rgb_pixel_target_[1] = colours[(pixels >> 4)&1];
						rgb_pixel_target_[2] = colours[(pixels >> 3)&1];
						rgb_pixel_target_[3] = colours[(pixels >> 2)&1];
						rgb_pixel_target_[4] = colours[(pixels >> 1)&1];
						rgb_pixel_target_[5] = colours[(pixels >> 0)&1];
					} else if(composite_pixel_target_) {
						const uint32_t colours[2] = {
							colour_forms_[paper_ ^ inverse_mask],
							colour_forms_[ink_ ^ inverse_mask]
						};
						composite_pixel_target_[0] = colours[(pixels >> 5)&1];
						composite_pixel_target_[1] = colours[(pixels >> 4)&1];
						composite_pixel_target_[2] = colours[(pixels >> 3)&1];
						composite_pixel_target_[3] = colours[(pixels >> 2)&1];
						composite_pixel_target_[4] = colours[(pixels >> 1)&1];
						composite_pixel_target_[5] = colours[(pixels >> 0)&1];
					}
				} else {
					switch(control_byte & 0x1f) {
						case 0x00:		ink_ = 0x0;	break;
						case 0x01:		ink_ = 0x4;	break;
						case 0x02:		ink_ = 0x2;	break;
						case 0x03:		ink_ = 0x6;	break;
						case 0x04:		ink_ = 0x1;	break;
						case 0x05:		ink_ = 0x5;	break;
						case 0x06:		ink_ = 0x3;	break;
						case 0x07:		ink_ = 0x7;	break;

						case 0x08:	case 0x09:	case 0x0a: case 0x0b:
						case 0x0c:	case 0x0d:	case 0x0e: case 0x0f:
							use_alternative_character_set_ = (control_byte&1);
							use_double_height_characters_ = (control_byte&2);
							blink_text_ = (control_byte&4);
							set_character_set_base_address();
						break;

						case 0x10:		paper_ = 0x0;	break;
						case 0x11:		paper_ = 0x4;	break;
						case 0x12:		paper_ = 0x2;	break;
						case 0x13:		paper_ = 0x6;	break;
						case 0x14:		paper_ = 0x1;	break;
						case 0x15:		paper_ = 0x5;	break;
						case 0x16:		paper_ = 0x3;	break;
						case 0x17:		paper_ = 0x7;	break;

						case 0x18: case 0x19: case 0x1a: case 0x1b:
						case 0x1c: case 0x1d: case 0x1e: case 0x1f:
							is_graphics_mode_ = (control_byte & 4);
							next_frame_is_sixty_hertz_ = !(control_byte & 2);
						break;

						default: break;
					}

					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						rgb_pixel_target_[0] = rgb_pixel_target_[1] =
						rgb_pixel_target_[2] = rgb_pixel_target_[3] =
						rgb_pixel_target_[4] = rgb_pixel_target_[5] = paper_ ^ inverse_mask;
					} else if(composite_pixel_target_) {
						composite_pixel_target_[0] = composite_pixel_target_[1] =
						composite_pixel_target_[2] = composite_pixel_target_[3] =
						composite_pixel_target_[4] = composite_pixel_target_[5] = colour_forms_[paper_ ^ inverse_mask];
					}
				}
				if(rgb_pixel_target_) rgb_pixel_target_ += 6;
				if(composite_pixel_target_) composite_pixel_target_ += 6;
				h_counter++;
			}

			if(h_counter == 40) {
				crt_.output_data(40 * 6);
				rgb_pixel_target_ = nullptr;
				composite_pixel_target_ = nullptr;
			}
		} else {
			// this is a blank line (or the equivalent part of a pixel line)
			if(h_counter < 48) {
				cycles_run_for = 48 - h_counter;
				clamp(
					int period = (counter_ < 224*64) ? 8 : 48;
					crt_.output_blank(period * 6);
				);
			} else if(h_counter < 54) {
				cycles_run_for = 54 - h_counter;
				clamp(crt_.output_sync(6 * 6));
			} else if(h_counter < 56) {
				cycles_run_for = 56 - h_counter;
				clamp(crt_.output_default_colour_burst(2 * 6));
			} else {
				cycles_run_for = 64 - h_counter;
				clamp(crt_.output_blank(8 * 6));
			}
		}

		counter_ = (counter_ + cycles_run_for)%counter_period_;
		number_of_cycles -= cycles_run_for;
	}
}